

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalGenerator::SelectMakeProgram
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *inMakeProgram,
          string *makeDefault)

{
  cmake *this_00;
  bool bVar1;
  char *val;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)inMakeProgram);
  bVar1 = cmSystemTools::IsOff((__return_storage_ptr__->_M_dataplus)._M_p);
  if (bVar1) {
    this_00 = this->CMakeInstance;
    std::__cxx11::string::string((string *)&local_38,"CMAKE_MAKE_PROGRAM",&local_39);
    val = cmake::GetCacheDefinition(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = cmSystemTools::IsOff(val);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
    bVar1 = cmSystemTools::IsOff((__return_storage_ptr__->_M_dataplus)._M_p);
    if (bVar1 && __return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::SelectMakeProgram(
  const std::string& inMakeProgram, const std::string& makeDefault) const
{
  std::string makeProgram = inMakeProgram;
  if (cmSystemTools::IsOff(makeProgram.c_str())) {
    const char* makeProgramCSTR =
      this->CMakeInstance->GetCacheDefinition("CMAKE_MAKE_PROGRAM");
    if (cmSystemTools::IsOff(makeProgramCSTR)) {
      makeProgram = makeDefault;
    } else {
      makeProgram = makeProgramCSTR;
    }
    if (cmSystemTools::IsOff(makeProgram.c_str()) && !makeProgram.empty()) {
      makeProgram = "CMAKE_MAKE_PROGRAM-NOTFOUND";
    }
  }
  return makeProgram;
}